

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O2

int decode_head(int *value,char *data,int len)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  iVar3 = -1;
  if (0 < len && data != (char *)0x0) {
    bVar2 = *data;
    uVar4 = (uint)bVar2;
    if ((char)bVar2 < '\0') {
      lVar5 = 1;
      bVar2 = 0;
      uVar6 = 0;
      while( true ) {
        if ((uVar4 & 0x40) == 0) {
          if (value != (int *)0x0) {
            *value = (uVar4 & 0x3f) << (bVar2 & 0x1f) | uVar6;
          }
          return (int)lVar5;
        }
        if (lVar5 - (ulong)(len - 1) == 1) break;
        pbVar1 = (byte *)(data + lVar5);
        uVar6 = uVar6 << 6 | *pbVar1 & 0x3f;
        uVar4 = uVar4 * 2;
        lVar5 = lVar5 + 1;
        bVar2 = bVar2 + 1;
        if ((*pbVar1 & 0xc0) != 0x80) {
          return -1;
        }
      }
      return 0;
    }
    iVar3 = 1;
    if (value != (int *)0x0) {
      *value = (uint)bVar2;
    }
  }
  return iVar3;
}

Assistant:

inline int decode_head(int* value, const char* data, int len)
{
    if (data == NULL || len <= 0)
        return -1;

    const unsigned char *s = (unsigned char *)data;
    unsigned int c = s[0];
    if (c < 0x80) {
        if (value) *value = c;
        return 1;
    }

    unsigned int res = 0;
    int count = 0;
    while (c & 0x40) {
        if (count + 1 >= len)
            return 0;
        int cc = s[++count];
        if ((cc & 0xC0) != 0x80)
            return -1;
        res = (res << 6) | (cc & 0x3F);
        c <<= 1;
    }

    res |= ((c & 0x7F) << (count * 5));
    if (value) *value = res;
    return count + 1;
}